

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CliffordLib.cpp
# Opt level: O0

void CtoE(Clifford *p)

{
  vector<Blade,_std::allocator<Blade>_> local_100;
  vector<Blade,_std::allocator<Blade>_> local_e8;
  vector<Blade,_std::allocator<Blade>_> local_d0;
  Clifford local_b8;
  Clifford local_a0;
  Clifford local_88;
  vector<Blade,_std::allocator<Blade>_> local_60;
  vector<Blade,_std::allocator<Blade>_> local_48;
  Clifford local_30;
  float local_14;
  Clifford *pCStack_10;
  float n;
  Clifford *p_local;
  
  pCStack_10 = p;
  std::vector<Blade,_std::allocator<Blade>_>::vector(&local_48,p);
  std::vector<Blade,_std::allocator<Blade>_>::vector(&local_60,&e);
  operator|(&local_30,&local_48,&local_60);
  operator<=(&local_14,&local_30);
  std::vector<Blade,_std::allocator<Blade>_>::~vector(&local_30);
  std::vector<Blade,_std::allocator<Blade>_>::~vector(&local_60);
  std::vector<Blade,_std::allocator<Blade>_>::~vector(&local_48);
  std::vector<Blade,_std::allocator<Blade>_>::vector(&local_d0,&Ie);
  std::vector<Blade,_std::allocator<Blade>_>::vector(&local_e8,pCStack_10);
  operator|(&local_b8,&local_d0,&local_e8);
  std::vector<Blade,_std::allocator<Blade>_>::vector(&local_100,&Ie);
  operator|(&local_a0,&local_b8,&local_100);
  operator/(&local_88,&local_a0,local_14);
  std::vector<Blade,_std::allocator<Blade>_>::operator=(pCStack_10,&local_88);
  std::vector<Blade,_std::allocator<Blade>_>::~vector(&local_88);
  std::vector<Blade,_std::allocator<Blade>_>::~vector(&local_a0);
  std::vector<Blade,_std::allocator<Blade>_>::~vector(&local_100);
  std::vector<Blade,_std::allocator<Blade>_>::~vector(&local_b8);
  std::vector<Blade,_std::allocator<Blade>_>::~vector(&local_e8);
  std::vector<Blade,_std::allocator<Blade>_>::~vector(&local_d0);
  return;
}

Assistant:

void CtoE(Clifford &p)
{
  float n;n<=(p|e);
  p=(Ie|p|Ie)/n;
}